

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask30_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1e | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 2;
  *puVar1 = in[2] << 0x1c | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 4;
  *puVar1 = in[3] << 0x1a | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 6;
  *puVar1 = in[4] << 0x18 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 8;
  *puVar1 = in[5] << 0x16 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] >> 10;
  *puVar1 = in[6] << 0x14 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6] >> 0xc;
  *puVar1 = in[7] << 0x12 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[7] >> 0xe;
  *puVar1 = in[8] << 0x10 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[8] >> 0x10;
  *puVar1 = in[9] << 0xe | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[9] >> 0x12;
  *puVar1 = in[10] << 0xc | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[10] >> 0x14;
  *puVar1 = in[0xb] << 10 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xb] >> 0x16;
  *puVar1 = in[0xc] << 8 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xc] >> 0x18;
  *puVar1 = in[0xd] << 6 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xd] >> 0x1a;
  *puVar1 = in[0xe] << 4 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xe] >> 0x1c;
  *puVar1 = in[0xf] << 2 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0x10];
  *puVar1 = in[0x11] << 0x1e | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0x11] >> 2;
  *puVar1 = in[0x12] << 0x1c | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x12] >> 4;
  *puVar1 = in[0x13] << 0x1a | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x13] >> 6;
  *puVar1 = in[0x14] << 0x18 | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x14] >> 8;
  *puVar1 = in[0x15] << 0x16 | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x15] >> 10;
  *puVar1 = in[0x16] << 0x14 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x16] >> 0xc;
  *puVar1 = in[0x17] << 0x12 | *puVar1;
  out[0x16] = in[0x17] >> 0xe;
  return out + 0x17;
}

Assistant:

uint32_t *__fastpackwithoutmask30_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (30 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (30 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (30 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (30 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (30 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (30 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (30 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (30 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (30 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (30 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (30 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (30 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (30 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (30 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (30 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (30 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (30 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (30 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (30 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (30 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (30 - 16);
  ++in;

  return out + 1;
}